

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O3

void ff_sqrt_any(flexfloat_t *dest,flexfloat_t *a)

{
  double dVar1;
  
  dVar1 = sqrt(a->value);
  dest->value = dVar1;
  flexfloat_sanitize(dest);
  return;
}

Assistant:

INLINE void ff_sqrt_any(flexfloat_t *dest, const flexfloat_t *a) {
    dest->value = sqrt(a->value);
    #ifdef FLEXFLOAT_TRACKING
    dest->exact_value = sqrt(a->exact_value);
    if(dest->tracking_fn) (dest->tracking_fn)(dest, dest->tracking_arg);
    #endif
    flexfloat_sanitize(dest);
    #ifdef FLEXFLOAT_STATS
    // TODO STATS
    // if(StatsEnabled) getOpStats(dest->desc)->sqrt += 1;
    #endif
}